

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_command_queue
clCreateCommandQueueWithPropertiesKHR
          (cl_context context,cl_device_id device,cl_queue_properties_khr *properties,
          cl_int *errcode_ret)

{
  CTracker *pCVar1;
  CLIntercept *this;
  byte bVar2;
  CLdispatchX *pCVar3;
  cl_command_queue queue;
  time_point end;
  allocator local_b9;
  cl_device_id device_local;
  cl_queue_properties *newProperties;
  time_point local_a8;
  cl_int localErrorCode;
  __int_type local_98;
  string local_90;
  string propsStr;
  string deviceInfo;
  
  this = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     (device_local = device, pCVar3 = CLIntercept::dispatchX(g_pIntercept,device),
     pCVar3->clCreateCommandQueueWithPropertiesKHR ==
     (_func_cl_command_queue_cl_context_cl_device_id_cl_queue_properties_khr_ptr_cl_int_ptr *)0x0))
  {
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x22;
    }
    return (cl_command_queue)0x0;
  }
  local_98 = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  newProperties = (cl_queue_properties *)0x0;
  deviceInfo._M_dataplus._M_p = (pointer)&deviceInfo.field_2;
  deviceInfo._M_string_length = 0;
  propsStr._M_dataplus._M_p = (pointer)&propsStr.field_2;
  propsStr._M_string_length = 0;
  deviceInfo.field_2._M_local_buf[0] = '\0';
  propsStr.field_2._M_local_buf[0] = '\0';
  bVar2 = (this->m_Config).CallLogging;
  if ((bool)bVar2 == true) {
    CLIntercept::getDeviceInfoString(this,1,&device_local,&deviceInfo);
    CLIntercept::getCommandQueuePropertiesString(this,properties,&propsStr);
    bVar2 = (this->m_Config).CallLogging;
  }
  if ((bVar2 & 1) != 0) {
    CLIntercept::callLoggingEnter
              (this,"clCreateCommandQueueWithPropertiesKHR",local_98,(cl_kernel)0x0,
               "context = %p, device = %s, properties = [ %s ]",context,deviceInfo._M_dataplus._M_p,
               propsStr._M_dataplus._M_p);
  }
  if ((this->m_Config).DummyOutOfOrderQueue == true) {
    CLIntercept::dummyCommandQueue(this,context,device_local);
  }
  if (((((((this->m_Config).DevicePerformanceTiming != false) ||
         ((this->m_Config).ITTPerformanceTiming != false)) ||
        ((this->m_Config).ChromePerformanceTiming != false)) ||
       (((this->m_Config).DevicePerfCounterEventBasedSampling != false ||
        ((this->m_Config).InOrderQueue != false)))) || ((this->m_Config).NoProfilingQueue != false))
     || (((this->m_Config).DefaultQueuePriorityHint != 0 ||
         ((this->m_Config).DefaultQueueThrottleHint != 0)))) {
    CLIntercept::createCommandQueuePropertiesOverride(this,device_local,properties,&newProperties);
  }
  localErrorCode = 0;
  if ((((this->m_Config).CallLogging == false) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_0012c515:
      errcode_ret = &localErrorCode;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_0012c515;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_a8.__d.__r = (duration)0;
  }
  else {
    local_a8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  if ((this->m_Config).DevicePerfCounterEventBasedSampling == true) {
    if ((newProperties == (cl_queue_properties *)0x0) ||
       (queue = CLIntercept::createMDAPICommandQueue
                          (this,context,device_local,newProperties,errcode_ret),
       queue == (cl_command_queue)0x0)) {
      queue = CLIntercept::createMDAPICommandQueue(this,context,device_local,properties,errcode_ret)
      ;
    }
  }
  else {
    queue = (cl_command_queue)0x0;
  }
  if (newProperties != (cl_queue_properties *)0x0 && queue == (cl_command_queue)0x0) {
    queue = (*pCVar3->clCreateCommandQueueWithPropertiesKHR)
                      (context,device_local,newProperties,errcode_ret);
  }
  if (queue == (cl_command_queue)0x0) {
    queue = (*pCVar3->clCreateCommandQueueWithPropertiesKHR)
                      (context,device_local,properties,errcode_ret);
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_98 &&
        (local_98 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_90,"",&local_b9);
      CLIntercept::updateHostTimingStats
                (this,"clCreateCommandQueueWithPropertiesKHR",&local_90,local_a8,end);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  if (newProperties != (cl_queue_properties *)0x0) {
    operator_delete__(newProperties);
  }
  newProperties = (cl_queue_properties *)0x0;
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar2 == false) && ((this->m_Config).NoErrors != true)) || (*errcode_ret == 0))
    goto LAB_0012c6d6;
  }
  else {
    if (*errcode_ret == 0) goto LAB_0012c6d6;
    CLIntercept::logError(this,"clCreateCommandQueueWithPropertiesKHR",*errcode_ret);
    bVar2 = (this->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors == true) {
    *errcode_ret = 0;
  }
LAB_0012c6d6:
  if ((queue != (cl_command_queue)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_CommandQueues;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreateCommandQueueWithPropertiesKHR",*errcode_ret,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0,"returned %p",queue);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_90,"",&local_b9);
    CLIntercept::chromeCallLoggingExit
              (this,"clCreateCommandQueueWithPropertiesKHR",&local_90,false,0,local_a8,end);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (queue != (cl_command_queue)0x0) {
    if ((((this->m_Config).ChromePerformanceTiming != false) ||
        ((this->m_Config).Emulate_cl_intel_unified_shared_memory == true)) &&
       (CLIntercept::addQueue(this,context,queue), (this->m_Config).ChromePerformanceTiming == true)
       ) {
      CLIntercept::chromeRegisterCommandQueue(this,queue);
    }
    if ((this->m_Config).QueueInfoLogging == true) {
      CLIntercept::logQueueInfo(this,device_local,queue);
    }
  }
  std::__cxx11::string::~string((string *)&propsStr);
  std::__cxx11::string::~string((string *)&deviceInfo);
  return queue;
}

Assistant:

CL_API_ENTRY cl_command_queue CL_API_CALL clCreateCommandQueueWithPropertiesKHR(
    cl_context context,
    cl_device_id device,
    const cl_queue_properties_khr* properties,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(device);
        if( dispatchX.clCreateCommandQueueWithPropertiesKHR )
        {
            GET_ENQUEUE_COUNTER();

            cl_queue_properties*    newProperties = NULL;
            cl_command_queue    retVal = NULL;

            std::string deviceInfo;
            std::string propsStr;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getDeviceInfoString(
                    1,
                    &device,
                    deviceInfo );
                pIntercept->getCommandQueuePropertiesString(
                    properties,
                    propsStr );
            }
            CALL_LOGGING_ENTER( "context = %p, device = %s, properties = [ %s ]",
                context,
                deviceInfo.c_str(),
                propsStr.c_str() );
            DUMMY_COMMAND_QUEUE( context, device );
            CREATE_COMMAND_QUEUE_OVERRIDE_INIT( device, properties, newProperties );
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

#if defined(USE_MDAPI)
            if( pIntercept->config().DevicePerfCounterEventBasedSampling )
            {
                if( ( retVal == NULL ) && newProperties )
                {
                    retVal = pIntercept->createMDAPICommandQueue(
                        context,
                        device,
                        newProperties,
                        errcode_ret );
                }
                if( retVal == NULL )
                {
                    retVal = pIntercept->createMDAPICommandQueue(
                        context,
                        device,
                        properties,
                        errcode_ret );
                }
            }
#endif

            if( ( retVal == NULL ) && newProperties )
            {
                retVal = dispatchX.clCreateCommandQueueWithPropertiesKHR(
                    context,
                    device,
                    newProperties,
                    errcode_ret );
            }
            if( retVal == NULL )
            {
                retVal = dispatchX.clCreateCommandQueueWithPropertiesKHR(
                    context,
                    device,
                    properties,
                    errcode_ret );
            }

            HOST_PERFORMANCE_TIMING_END();
            COMMAND_QUEUE_PROPERTIES_CLEANUP( newProperties );
            CHECK_ERROR( errcode_ret[0] );
            ADD_OBJECT_ALLOCATION( retVal );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );
            ADD_QUEUE( context, retVal );
            QUEUE_INFO_LOGGING( device, retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}